

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndarray.h
# Opt level: O2

void __thiscall tvm::runtime::NDArray::NDArray(NDArray *this,ObjectPtr<tvm::runtime::Object> *data)

{
  ObjectPtr<tvm::runtime::Object> local_8;
  
  local_8 = (ObjectPtr<tvm::runtime::Object>)data->data_;
  if (local_8.data_ == (Object *)0x0) {
    (this->super_ObjectRef).data_.data_ = (Object *)0x0;
  }
  else {
    LOCK();
    ((local_8.data_)->ref_counter_).super___atomic_base<int>._M_i =
         ((local_8.data_)->ref_counter_).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    (this->super_ObjectRef).data_.data_ = local_8.data_;
    LOCK();
    ((local_8.data_)->ref_counter_).super___atomic_base<int>._M_i =
         ((local_8.data_)->ref_counter_).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  ObjectPtr<tvm::runtime::Object>::~ObjectPtr(&local_8);
  return;
}

Assistant:

explicit NDArray(ObjectPtr<Object> data)
      : ObjectRef(data) {}